

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

void __thiscall crnlib::mip_level::clear(mip_level *this)

{
  image_u8 *p;
  color_quad<unsigned_char,_int> *p_00;
  dxt_image *p_01;
  element *p_02;
  
  this->m_width = 0;
  this->m_height = 0;
  this->m_comp_flags = cDefaultCompFlags;
  this->m_format = PIXEL_FMT_INVALID;
  this->m_orient_flags = cDefaultOrientationFlags;
  p = this->m_pImage;
  if (p != (image_u8 *)0x0) {
    p_00 = (p->m_pixel_buf).m_p;
    if (p_00 != (color_quad<unsigned_char,_int> *)0x0) {
      crnlib_free(p_00);
    }
    crnlib_free(p);
    this->m_pImage = (image_u8 *)0x0;
  }
  p_01 = this->m_pDXTImage;
  if (p_01 != (dxt_image *)0x0) {
    p_02 = (p_01->m_elements).m_p;
    if (p_02 != (element *)0x0) {
      crnlib_free(p_02);
    }
    crnlib_free(p_01);
    this->m_pDXTImage = (dxt_image *)0x0;
  }
  return;
}

Assistant:

void mip_level::clear() {
  m_width = 0;
  m_height = 0;
  m_comp_flags = pixel_format_helpers::cDefaultCompFlags;
  m_format = PIXEL_FMT_INVALID;
  m_orient_flags = cDefaultOrientationFlags;

  if (m_pImage) {
    crnlib_delete(m_pImage);
    m_pImage = NULL;
  }

  if (m_pDXTImage) {
    crnlib_delete(m_pDXTImage);
    m_pDXTImage = NULL;
  }
}